

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_Value.h
# Opt level: O3

bool __thiscall choc::value::Type::Object::operator==(Object *this,Object *other)

{
  byte bVar1;
  size_t sVar2;
  MemberNameAndType *pMVar3;
  MemberNameAndType *pMVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  
  sVar2 = (this->className)._M_len;
  if (sVar2 != (other->className)._M_len) {
    return false;
  }
  if (((sVar2 == 0) ||
      (iVar6 = bcmp((this->className)._M_str,(other->className)._M_str,sVar2), iVar6 == 0)) &&
     (uVar7 = (this->members).size, uVar7 == (other->members).size)) {
    if (uVar7 != 0) {
      lVar9 = 0x20;
      uVar8 = 0;
      do {
        pMVar3 = (this->members).items;
        sVar2 = *(size_t *)((long)pMVar3 + lVar9 + -0x20);
        pMVar4 = (other->members).items;
        if (((sVar2 != *(size_t *)((long)pMVar4 + lVar9 + -0x20)) ||
            ((sVar2 != 0 &&
             (iVar6 = bcmp(*(void **)((long)pMVar3 + lVar9 + -0x18),
                           *(void **)((long)pMVar4 + lVar9 + -0x18),sVar2), iVar6 != 0)))) ||
           (bVar1 = *(byte *)((long)pMVar3 + lVar9 + -0x10),
           bVar1 != *(byte *)((long)pMVar4 + lVar9 + -0x10))) goto LAB_001cb2fc;
        if (bVar1 < 0x80) {
          if (bVar1 == 0x30) {
            if (*(char *)((long)pMVar3 + lVar9 + -8) != *(char *)((long)pMVar4 + lVar9 + -8)) {
              return false;
            }
            if (*(int *)((long)pMVar3 + lVar9 + -4) != *(int *)((long)pMVar4 + lVar9 + -4)) {
              return false;
            }
            goto LAB_001cb2df;
          }
          if (bVar1 == 0x40) {
            if (((*(char *)((long)pMVar3 + lVar9 + -8) == *(char *)((long)pMVar4 + lVar9 + -8)) &&
                (*(int *)((long)pMVar3 + lVar9 + -4) == *(int *)((long)pMVar4 + lVar9 + -4))) &&
               (*(int *)((long)&(pMVar3->name)._M_len + lVar9) ==
                *(int *)((long)&(pMVar4->name)._M_len + lVar9))) goto LAB_001cb2df;
            goto LAB_001cb2fc;
          }
        }
        else {
          if (bVar1 == 0x80) {
            bVar5 = AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup>::operator==
                              (*(AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup> **)
                                ((long)pMVar3 + lVar9 + -8),
                               *(AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup> **)
                                ((long)pMVar4 + lVar9 + -8));
          }
          else {
            if (bVar1 != 0x90) goto LAB_001cb2e3;
            bVar5 = operator==(*(Object **)((long)pMVar3 + lVar9 + -8),
                               *(Object **)((long)pMVar4 + lVar9 + -8));
          }
          if (bVar5 == false) goto LAB_001cb2fc;
LAB_001cb2df:
          uVar7 = (this->members).size;
        }
LAB_001cb2e3:
        uVar8 = uVar8 + 1;
        lVar9 = lVar9 + 0x30;
      } while (uVar8 < uVar7);
    }
    bVar5 = true;
  }
  else {
LAB_001cb2fc:
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool operator== (const Object& other) const
    {
        if (className != other.className)
            return false;

        if (members.size != other.members.size)
            return false;

        for (uint32_t i = 0; i < members.size; ++i)
            if (members[i].name != other.members[i].name
                    || members[i].type != other.members[i].type)
                return false;

        return true;
    }